

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall
adios2::core::Engine::DoPutSync(Engine *this,Variable<int> *param_1,int32_t *param_2)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"DoPutSync",&local_31);
  ThrowUp(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Engine::DoPutStructSync(VariableStruct &, const void *) { ThrowUp("DoPutStructSync"); }